

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 gen_lea_mode(CPUM68KState_conflict *env,DisasContext_conflict2 *s,int mode,int reg0,
                     int opsize)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t uVar2;
  int arg2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 *ppTVar5;
  uint32_t val;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(mode) {
  case 2:
switchD_0067e965_caseD_2:
    ppTVar5 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar5 = tcg_ctx->cpu_aregs;
    }
    return ppTVar5[(uint)reg0];
  case 3:
    if (opsize != 7) goto switchD_0067e965_caseD_2;
    break;
  case 4:
    if (opsize != 7) {
      ppTVar5 = s->writeback;
      if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
        ppTVar5 = tcg_ctx->cpu_aregs;
      }
      pTVar4 = ppTVar5[(uint)reg0];
      pTVar3 = tcg_temp_new_i32(tcg_ctx);
      mark_to_release(s,pTVar3);
      if ((reg0 == 7 && opsize == 0) && ((s->env->features & 1) != 0)) {
        arg2 = 2;
      }
      else {
        arg2 = opsize_bytes(opsize);
      }
      tcg_gen_subi_i32_m68k(tcg_ctx,pTVar3,pTVar4,arg2);
      return pTVar3;
    }
    break;
  case 5:
    ppTVar5 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar5 = tcg_ctx->cpu_aregs;
    }
    pTVar4 = ppTVar5[(uint)reg0];
    pTVar3 = tcg_temp_new_i32(tcg_ctx);
    mark_to_release(s,pTVar3);
    uVar2 = read_im16(env,s);
    tcg_gen_addi_i32_m68k(tcg_ctx,pTVar3,pTVar4,(int)(short)uVar2);
    return pTVar3;
  case 6:
    ppTVar5 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar5 = tcg_ctx->cpu_aregs;
    }
    pTVar4 = ppTVar5[(uint)reg0];
LAB_0067eaaa:
    pTVar4 = gen_lea_indexed(env,s,pTVar4);
    return pTVar4;
  case 7:
    switch(reg0) {
    case 0:
      uVar2 = read_im16(env,s);
      val = (uint32_t)(short)uVar2;
      break;
    case 1:
      val = read_im32(env,s);
      break;
    case 2:
      tVar1 = s->pc;
      uVar2 = read_im16(env,s);
      val = (int)(short)uVar2 + tVar1;
      break;
    case 3:
      pTVar4 = tcg_ctx->NULL_QREG;
      goto LAB_0067eaaa;
    default:
      goto switchD_0067e965_caseD_0;
    }
    pTVar4 = tcg_const_i32_m68k(tcg_ctx,val);
    mark_to_release(s,pTVar4);
    return pTVar4;
  }
switchD_0067e965_caseD_0:
  return tcg_ctx->NULL_QREG;
}

Assistant:

static TCGv gen_lea_mode(CPUM68KState *env, DisasContext *s,
                         int mode, int reg0, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    uint16_t ext;
    uint32_t offset;

    switch (mode) {
    case 0: /* Data register direct.  */
    case 1: /* Address register direct.  */
        return tcg_ctx->NULL_QREG;
    case 3: /* Indirect postincrement.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        /* fallthru */
    case 2: /* Indirect register */
        return get_areg(s, reg0);
    case 4: /* Indirect predecrememnt.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if (reg0 == 7 && opsize == OS_BYTE &&
            m68k_feature(s->env, M68K_FEATURE_M68000)) {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, 2);
        } else {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, opsize_bytes(opsize));
        }
        return tmp;
    case 5: /* Indirect displacement.  */
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        ext = read_im16(env, s);
        tcg_gen_addi_i32(tcg_ctx, tmp, reg, (int16_t)ext);
        return tmp;
    case 6: /* Indirect index + displacement.  */
        reg = get_areg(s, reg0);
        return gen_lea_indexed(env, s, reg);
    case 7: /* Other */
        switch (reg0) {
        case 0: /* Absolute short.  */
            offset = (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 1: /* Absolute long.  */
            offset = read_im32(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 2: /* pc displacement  */
            offset = s->pc;
            offset += (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 3: /* pc index+displacement.  */
            return gen_lea_indexed(env, s, tcg_ctx->NULL_QREG);
        case 4: /* Immediate.  */
        default:
            return tcg_ctx->NULL_QREG;
        }
    }
    /* Should never happen.  */
    return tcg_ctx->NULL_QREG;
}